

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkCompareSupports(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_2c;
  int nNodesOld;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Abc_Ntk_t *pNtk_local;
  
  vSupp = (Vec_Ptr_t *)pNtk;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupp + 2)), local_2c < iVar1;
        local_2c = local_2c + 1) {
      pTemp = Abc_NtkObj((Abc_Ntk_t *)vSupp,local_2c);
      if (((pTemp != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pTemp), iVar1 != 0)) &&
         (iVar1 = Abc_AigNodeIsChoice(pTemp), iVar1 != 0)) {
        pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,&pTemp,1);
        uVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj);
        Vec_PtrFree((Vec_Ptr_t *)pObj);
        for (_nNodesOld = (Abc_Obj_t *)(pTemp->field_5).pData; _nNodesOld != (Abc_Obj_t *)0x0;
            _nNodesOld = (Abc_Obj_t *)(_nNodesOld->field_5).pData) {
          pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,(Abc_Obj_t **)&nNodesOld,1);
          uVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj);
          if (uVar2 != uVar3) {
            uVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj);
            printf("Choice orig = %3d  Choice new = %3d\n",(ulong)uVar2,(ulong)uVar3);
          }
          Vec_PtrFree((Vec_Ptr_t *)pObj);
        }
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                ,0x8a4,"void Abc_NtkCompareSupports(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkCompareSupports( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj, * pTemp;
    int i, nNodesOld;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        nNodesOld = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );

        for ( pTemp = (Abc_Obj_t *)pObj->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
        {
            vSupp = Abc_NtkNodeSupport( pNtk, &pTemp, 1 );
            if ( nNodesOld != Vec_PtrSize(vSupp) )
                printf( "Choice orig = %3d  Choice new = %3d\n", nNodesOld, Vec_PtrSize(vSupp) );
            Vec_PtrFree( vSupp );
        }
    }
}